

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void add_objsymbol(ObjectUnit *ou,Symbol *newsym)

{
  long lVar1;
  int iVar2;
  unsigned_long uVar3;
  long in_RSI;
  long in_RDI;
  Symbol **chain;
  Symbol *sym;
  long *local_20;
  
  lVar1 = *(long *)(in_RDI + 0x48);
  uVar3 = elf_hash(*(char **)(in_RSI + 0x20));
  local_20 = (long *)(lVar1 + (uVar3 & 0x1f) * 8);
  while (lVar1 = *local_20, lVar1 != 0) {
    iVar2 = strcmp(*(char **)(in_RSI + 0x20),*(char **)(lVar1 + 0x20));
    if (iVar2 == 0) {
      ierror("add_objsymbol(): %s defined twice",*(undefined8 *)(in_RSI + 0x20));
    }
    local_20 = (long *)(lVar1 + 0x18);
  }
  *local_20 = in_RSI;
  return;
}

Assistant:

static void add_objsymbol(struct ObjectUnit *ou,struct Symbol *newsym)
/* Add a symbol to an object unit's symbol table. The symbol name
   must be unique within the object, otherwise an internal error
   will occur! */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(newsym->name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(newsym->name,sym->name))
      ierror("add_objsymbol(): %s defined twice",newsym->name);
    chain = &sym->obj_chain;
  }
  *chain = newsym;
}